

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * Matrix::mul(Matrix *__return_storage_ptr__,Matrix *mat,double coef)

{
  bool bVar1;
  reference this;
  reference pdVar2;
  double *val;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *vec;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  double coef_local;
  Matrix *mat_local;
  Matrix *result;
  
  Matrix(__return_storage_ptr__,mat);
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(&__return_storage_ptr__->m_vals);
  vec = (vector<double,_std::allocator<double>_> *)
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end(&__return_storage_ptr__->m_vals);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                     *)&vec), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
           ::operator*(&__end1);
    __end2 = std::vector<double,_std::allocator<double>_>::begin(this);
    val = (double *)std::vector<double,_std::allocator<double>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                       *)&val), bVar1) {
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end2);
      *pdVar2 = coef * *pdVar2;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::mul(const Matrix& mat, double coef){
    Matrix result=mat;
    
    for(auto& vec: result.m_vals){
        for(auto& val: vec){
            val*=coef;
        }
    }
    
    return result;
}